

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow *parent_window)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ImGuiWindow **ppIVar5;
  ImGuiWindow *in_RDI;
  ImGuiWindow *window;
  int i;
  ImGuiWindow *bottom_most_visible_window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_1c;
  ImGuiWindow *local_18;
  
  pIVar1 = GImGui;
  local_1c = FindWindowDisplayIndex
                       ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                       );
  local_18 = in_RDI;
  do {
    if (local_1c < 0) {
      return local_18;
    }
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_1c);
    window_00 = *ppIVar5;
    if ((window_00->Flags & 0x1000000U) == 0) {
      bVar2 = IsWindowWithinBeginStackOf(window_00,in_RDI);
      if (!bVar2) {
        return local_18;
      }
      bVar2 = IsWindowActiveAndVisible(window_00);
      if (bVar2) {
        iVar3 = GetWindowDisplayLayer(window_00);
        iVar4 = GetWindowDisplayLayer(in_RDI);
        if (iVar3 <= iVar4) {
          local_18 = window_00;
        }
      }
    }
    local_1c = local_1c + -1;
  } while( true );
}

Assistant:

ImGuiWindow* ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow* parent_window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* bottom_most_visible_window = parent_window;
    for (int i = FindWindowDisplayIndex(parent_window); i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
            continue;
        if (!IsWindowWithinBeginStackOf(window, parent_window))
            break;
        if (IsWindowActiveAndVisible(window) && GetWindowDisplayLayer(window) <= GetWindowDisplayLayer(parent_window))
            bottom_most_visible_window = window;
    }
    return bottom_most_visible_window;
}